

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstring.cpp
# Opt level: O0

void __thiscall TPZString::SimplifyWhiteSpace(TPZString *this)

{
  char cVar1;
  size_t sVar2;
  long in_RDI;
  char next;
  char current;
  uint length;
  uint newpos;
  uint i;
  TPZString *in_stack_ffffffffffffffd8;
  undefined1 local_16;
  undefined4 local_10;
  undefined4 local_c;
  
  local_10 = 0;
  sVar2 = Length(in_stack_ffffffffffffffd8);
  for (local_c = 0; local_c < (int)sVar2 - 1U; local_c = local_c + 1) {
    cVar1 = *(char *)(*(long *)(in_RDI + 8) + (ulong)local_c);
    if (cVar1 == ' ') {
      if (local_c != 0) {
        *(undefined1 *)(*(long *)(in_RDI + 8) + (ulong)local_10) = 0x20;
        local_10 = local_10 + 1;
      }
      local_16 = *(char *)(*(long *)(in_RDI + 8) + (ulong)(local_c + 1));
      while (local_16 == ' ') {
        local_16 = *(char *)(*(long *)(in_RDI + 8) + (ulong)(local_c + 2));
        local_c = local_c + 1;
      }
      *(char *)(*(long *)(in_RDI + 8) + (ulong)local_10) = local_16;
    }
    else if (local_10 != local_c) {
      *(char *)(*(long *)(in_RDI + 8) + (ulong)local_10) = cVar1;
    }
    local_10 = local_10 + 1;
  }
  *(undefined1 *)(*(long *)(in_RDI + 8) + (ulong)local_10) = 0;
  return;
}

Assistant:

void TPZString::SimplifyWhiteSpace()
{
	unsigned int i, newpos = 0;
	const unsigned int length = Length();
	char current = '0', next = '0';
	for (i = 0; i < length - 1; i++)
	{
		current = fStore[i];
		if (current == ' ')
		{
			if (i)
			{
				fStore[newpos] = ' ';
				newpos++;
			}
			next = fStore[i + 1];
			while (next == ' ')
			{
				i++;
				next = fStore[i + 1];
			}
			fStore[newpos] = next;
			newpos++;
		}
		else
		{
			if (newpos != i) fStore[newpos] = current;
			newpos++;
		}
	}
	fStore[newpos] = '\0';
}